

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

TypedParam * solver_params_get_val(SolverTypedParams *params,char *key,ParamType type)

{
  ParamType PVar1;
  size_t sVar2;
  SolverTypedParamsEntry *pSVar3;
  char *pcVar4;
  char *fmt;
  int line;
  char *pcVar5;
  
  pSVar3 = (SolverTypedParamsEntry *)stbds_hmget_key(params->entries,0x18,key,8,1);
  params->entries = pSVar3;
  if ((pSVar3 == (SolverTypedParamsEntry *)0x0) ||
     (sVar2 = pSVar3[-2].value.field_2.sizeval, sVar2 == 0xffffffffffffffff)) {
    fmt = 
    "%s :: Internal error. Key `%s` is invalid. Make sure that the SolverDescriptor listed parameters match with the key you are trying to unpack."
    ;
    pcVar5 = "solver_params_get_key";
    line = 0x203;
  }
  else {
    if (pSVar3[sVar2].value.count < 1) {
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
              ,0x211,"Internal error. Tryed to unpack key `%s`, but its count is <= 0     (%d).",key
             );
      abort();
    }
    PVar1 = pSVar3[sVar2].value.type;
    pcVar4 = param_type_as_str(type);
    if (PVar1 == type) {
      log_log(0x20,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
              ,0x21e,"Getting parameter `%s` as type `%s`",key,pcVar4);
      return &pSVar3[sVar2].value;
    }
    param_type_as_str(pSVar3[sVar2].value.type);
    fmt = "Internal error. Tryed to unpack key `%s` as type `%s`, but the actual type is `%s`.";
    line = 0x217;
    pcVar5 = key;
    key = pcVar4;
  }
  log_log(0x80,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
          ,line,fmt,pcVar5,key);
  abort();
}

Assistant:

static inline TypedParam *solver_params_get_val(SolverTypedParams *params,
                                                char *key, ParamType type) {
    TypedParam *p = solver_params_get_key(params, key);
    if (p) {
        if (p->count <= 0) {
            log_fatal(
                "Internal error. Tryed to unpack key `%s`, but its count is <= "
                "0     (%d).",
                key, p->count);

            abort();
        } else if (p->type != type) {
            log_fatal("Internal error. Tryed to unpack key `%s` as type `%s`, "
                      "but the actual type is `%s`.",
                      key, param_type_as_str(type), param_type_as_str(p->type));

            abort();
        }
    }

    log_info("Getting parameter `%s` as type `%s`", key,
             param_type_as_str(type));
    return p;
}